

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O2

void print(char *msg)

{
  self *psVar1;
  SourceFile file;
  Logger local_1020;
  undefined1 local_50 [12];
  string local_40;
  Timestamp local_20;
  
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<111>
              ((SourceFile *)local_50,
               (char (*) [111])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/timer/timerqueue_unittest.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_50._0_8_;
    file.m_size = local_50._8_4_;
    sznet::Logger::Logger(&local_1020,file,0x1d);
    psVar1 = sznet::LogStream::operator<<(&local_1020.m_impl.m_stream,"time:");
    local_20 = sznet::Timestamp::now();
    sznet::Timestamp::toFormattedString_abi_cxx11_(&local_40,&local_20,true);
    psVar1 = sznet::LogStream::operator<<(psVar1,&local_40);
    psVar1 = sznet::LogStream::operator<<(psVar1," msg:");
    sznet::LogStream::operator<<(psVar1,msg);
    std::__cxx11::string::~string((string *)&local_40);
    sznet::Logger::~Logger(&local_1020);
  }
  cnt = cnt + 1;
  if (cnt == 0x14) {
    sznet::net::EventLoop::quit(g_timequeue_loop);
  }
  return;
}

Assistant:

void print(const char* msg)
{
	LOG_INFO << "time:" << Timestamp::now().toFormattedString() << " msg:" << msg;
	if (++cnt == 20)
	{
		g_timequeue_loop->quit();
	}
}